

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transreg.cpp
# Opt level: O0

TransliteratorEntry * __thiscall
icu_63::TransliteratorRegistry::find
          (TransliteratorRegistry *this,UnicodeString *source,UnicodeString *target,
          UnicodeString *variant)

{
  UBool UVar1;
  int32_t iVar2;
  UnicodeString local_340;
  UnicodeString local_300;
  undefined4 local_2bc;
  undefined1 local_2b8 [8];
  UnicodeString ID;
  TransliteratorEntry *entry;
  undefined1 local_260 [8];
  TransliteratorSpec trg;
  TransliteratorSpec src;
  UnicodeString *variant_local;
  UnicodeString *target_local;
  UnicodeString *source_local;
  TransliteratorRegistry *this_local;
  
  TransliteratorSpec::TransliteratorSpec((TransliteratorSpec *)&trg.res,source);
  TransliteratorSpec::TransliteratorSpec((TransliteratorSpec *)local_260,target);
  icu_63::UnicodeString::UnicodeString((UnicodeString *)local_2b8);
  TransliteratorIDParser::STVtoID(source,target,variant,(UnicodeString *)local_2b8);
  ID.fUnion._48_8_ = Hashtable::get(&this->registry,(UnicodeString *)local_2b8);
  this_local = (TransliteratorRegistry *)ID.fUnion._48_8_;
  if ((TransliteratorRegistry *)ID.fUnion._48_8_ == (TransliteratorRegistry *)0x0) {
    iVar2 = icu_63::UnicodeString::length(variant);
    if (iVar2 != 0) {
      ID.fUnion._48_8_ =
           findInDynamicStore(this,(TransliteratorSpec *)&trg.res,(TransliteratorSpec *)local_260,
                              variant);
      this_local = (TransliteratorRegistry *)ID.fUnion._48_8_;
      if (((TransliteratorRegistry *)ID.fUnion._48_8_ != (TransliteratorRegistry *)0x0) ||
         (ID.fUnion._48_8_ =
               findInStaticStore(this,(TransliteratorSpec *)&trg.res,(TransliteratorSpec *)local_260
                                 ,variant), this_local = (TransliteratorRegistry *)ID.fUnion._48_8_,
         (TransliteratorRegistry *)ID.fUnion._48_8_ != (TransliteratorRegistry *)0x0))
      goto LAB_002e9cb7;
      ID.fUnion._48_8_ = 0;
    }
    while( true ) {
      TransliteratorSpec::reset((TransliteratorSpec *)&trg.res);
      while( true ) {
        icu_63::UnicodeString::UnicodeString(&local_300);
        ID.fUnion._48_8_ =
             findInDynamicStore(this,(TransliteratorSpec *)&trg.res,(TransliteratorSpec *)local_260,
                                &local_300);
        icu_63::UnicodeString::~UnicodeString(&local_300);
        if (ID.fUnion._48_8_ != 0) {
          this_local = (TransliteratorRegistry *)ID.fUnion._48_8_;
          goto LAB_002e9cb7;
        }
        icu_63::UnicodeString::UnicodeString(&local_340);
        ID.fUnion._48_8_ =
             findInStaticStore(this,(TransliteratorSpec *)&trg.res,(TransliteratorSpec *)local_260,
                               &local_340);
        icu_63::UnicodeString::~UnicodeString(&local_340);
        if (ID.fUnion._48_8_ != 0) {
          this_local = (TransliteratorRegistry *)ID.fUnion._48_8_;
          goto LAB_002e9cb7;
        }
        UVar1 = TransliteratorSpec::hasFallback((TransliteratorSpec *)&trg.res);
        if (UVar1 == '\0') break;
        TransliteratorSpec::next((TransliteratorSpec *)&trg.res);
      }
      UVar1 = TransliteratorSpec::hasFallback((TransliteratorSpec *)local_260);
      if (UVar1 == '\0') break;
      TransliteratorSpec::next((TransliteratorSpec *)local_260);
    }
    this_local = (TransliteratorRegistry *)0x0;
  }
LAB_002e9cb7:
  local_2bc = 1;
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_2b8);
  TransliteratorSpec::~TransliteratorSpec((TransliteratorSpec *)local_260);
  TransliteratorSpec::~TransliteratorSpec((TransliteratorSpec *)&trg.res);
  return (TransliteratorEntry *)this_local;
}

Assistant:

TransliteratorEntry* TransliteratorRegistry::find(UnicodeString& source,
                                    UnicodeString& target,
                                    UnicodeString& variant) {
    
    TransliteratorSpec src(source);
    TransliteratorSpec trg(target);
    TransliteratorEntry* entry;

    // Seek exact match in hashtable.  Temporary fix for ICU 4.6.
    // TODO: The general logic for finding a matching transliterator needs to be reviewed.
    // ICU ticket #8089
    UnicodeString ID;
    TransliteratorIDParser::STVtoID(source, target, variant, ID);
    entry = (TransliteratorEntry*) registry.get(ID);
    if (entry != 0) {
        // std::string ss;
        // std::cout << ID.toUTF8String(ss) << std::endl;
        return entry;
    }

    if (variant.length() != 0) {
        
        // Seek exact match in hashtable
        entry = findInDynamicStore(src, trg, variant);
        if (entry != 0) {
            return entry;
        }
        
        // Seek exact match in locale resources
        entry = findInStaticStore(src, trg, variant);
        if (entry != 0) {
            return entry;
        }
    }

    for (;;) {
        src.reset();
        for (;;) {
            // Seek match in hashtable
            entry = findInDynamicStore(src, trg, NO_VARIANT);
            if (entry != 0) {
                return entry;
            }
            
            // Seek match in locale resources
            entry = findInStaticStore(src, trg, NO_VARIANT);
            if (entry != 0) {
                return entry;
            }
            if (!src.hasFallback()) {
                break;
            }
            src.next();
        }
        if (!trg.hasFallback()) {
            break;
        }
        trg.next();
    }

    return 0;
}